

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TextWrappedV(char *fmt,__va_list_tag *args)

{
  float *pfVar1;
  
  pfVar1 = &(GImGui->CurrentWindow->DC).TextWrapPos;
  if (*pfVar1 <= 0.0 && *pfVar1 != 0.0) {
    PushTextWrapPos(0.0);
    TextV(fmt,args);
    PopTextWrapPos();
    return;
  }
  TextV(fmt,args);
  return;
}

Assistant:

void ImGui::TextWrappedV(const char* fmt, va_list args)
{
    bool need_backup = (GImGui->CurrentWindow->DC.TextWrapPos < 0.0f);  // Keep existing wrap position if one is already set
    if (need_backup)
        PushTextWrapPos(0.0f);
    TextV(fmt, args);
    if (need_backup)
        PopTextWrapPos();
}